

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O0

GCproto * lj_bcread(LexState *ls)

{
  lua_State *plVar1;
  TValue *pTVar2;
  int iVar3;
  GCproto *pGVar4;
  LexState *in_RDI;
  char *startp;
  MSize len;
  GCproto *pt;
  lua_State *L;
  uint32_t v;
  char *in_stack_ffffffffffffff38;
  ErrMsg em;
  undefined4 in_stack_ffffffffffffff40;
  uint32_t in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff64;
  LexState *ls_00;
  
  plVar1 = in_RDI->L;
  in_RDI->lastline = (int)plVar1->top - (plVar1->stack).ptr32;
  ls_00 = (LexState *)&in_RDI->sb;
  (((SBuf *)ls_00)->p).ptr32 = (in_RDI->sb).b.ptr32;
  iVar3 = bcread_header(in_RDI);
  if (iVar3 == 0) {
    bcread_error((LexState *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (ErrMsg)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  }
  while ((em = (ErrMsg)((ulong)in_stack_ffffffffffffff38 >> 0x20), in_RDI->pe <= in_RDI->p ||
         (*in_RDI->p != '\0'))) {
    if ((uint)((int)in_RDI->pe - (int)in_RDI->p) < 5) {
      bcread_fill((LexState *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                  (MSize)((ulong)in_RDI >> 0x20),(int)in_RDI);
    }
    in_stack_ffffffffffffff44 = lj_buf_ruleb128(&in_RDI->p);
    if (in_stack_ffffffffffffff44 == 0) goto LAB_0014863d;
    in_stack_ffffffffffffff64 = in_stack_ffffffffffffff44;
    if ((uint)((int)in_RDI->pe - (int)in_RDI->p) < in_stack_ffffffffffffff44) {
      bcread_fill((LexState *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff60),
                  (MSize)((ulong)in_RDI >> 0x20),(int)in_RDI);
    }
    in_stack_ffffffffffffff38 = in_RDI->p;
    pGVar4 = lj_bcread_proto(ls_00);
    if (in_RDI->p != in_stack_ffffffffffffff38 + in_stack_ffffffffffffff44) {
      bcread_error((LexState *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (ErrMsg)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    }
    pTVar2 = plVar1->top;
    (pTVar2->u32).lo = (uint32_t)pGVar4;
    (pTVar2->field_2).it = 0xfffffff8;
    pTVar2 = plVar1->top;
    plVar1->top = pTVar2 + 1;
    if ((TValue *)(ulong)(plVar1->maxstack).ptr32 <= pTVar2 + 1) {
      lj_state_growstack1((lua_State *)0x14862e);
    }
  }
  in_RDI->p = in_RDI->p + 1;
LAB_0014863d:
  if (((in_RDI->pe != in_RDI->p) && (in_RDI->endmark == 0)) ||
     (plVar1->top + -1 != (TValue *)((ulong)(plVar1->stack).ptr32 + (long)in_RDI->lastline))) {
    bcread_error((LexState *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),em);
  }
  plVar1->top = plVar1->top + -1;
  return (GCproto *)(ulong)(plVar1->top->u32).lo;
}

Assistant:

GCproto *lj_bcread(LexState *ls)
{
  lua_State *L = ls->L;
  lj_assertLS(ls->c == BCDUMP_HEAD1, "bad bytecode header");
  bcread_savetop(L, ls, L->top);
  lj_buf_reset(&ls->sb);
  /* Check for a valid bytecode dump header. */
  if (!bcread_header(ls))
    bcread_error(ls, LJ_ERR_BCFMT);
  for (;;) {  /* Process all prototypes in the bytecode dump. */
    GCproto *pt;
    MSize len;
    const char *startp;
    /* Read length. */
    if (ls->p < ls->pe && ls->p[0] == 0) {  /* Shortcut EOF. */
      ls->p++;
      break;
    }
    bcread_want(ls, 5);
    len = bcread_uleb128(ls);
    if (!len) break;  /* EOF */
    bcread_need(ls, len);
    startp = ls->p;
    pt = lj_bcread_proto(ls);
    if (ls->p != startp + len)
      bcread_error(ls, LJ_ERR_BCBAD);
    setprotoV(L, L->top, pt);
    incr_top(L);
  }
  if ((ls->pe != ls->p && !ls->endmark) || L->top-1 != bcread_oldtop(L, ls))
    bcread_error(ls, LJ_ERR_BCBAD);
  /* Pop off last prototype. */
  L->top--;
  return protoV(L->top);
}